

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O3

intrusive_ptr<cppcms::application> __thiscall
cppcms::application_specific_pool::_async_legacy_policy::get
          (_async_legacy_policy *this,service *srv)

{
  service *this_00;
  service *app;
  service *in_RDX;
  
  this_00 = srv[2].impl_.ptr_;
  if (*(int *)&(((this_00->acceptors_).
                 super__Vector_base<std::shared_ptr<cppcms::impl::cgi::acceptor>,_std::allocator<std::shared_ptr<cppcms::impl::cgi::acceptor>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->
               super___shared_ptr<cppcms::impl::cgi::acceptor,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      == -1) {
    (this->super__policy)._vptr__policy = (_func_int **)0x0;
  }
  else {
    app = srv[3].impl_.ptr_;
    if (app == (service *)0x0) {
      app = (service *)get_new((application_specific_pool *)this_00,in_RDX);
      srv[3].impl_.ptr_ = app;
      (this->super__policy)._vptr__policy = (_func_int **)app;
      if (app == (service *)0x0) {
        return (intrusive_ptr<cppcms::application>)(application *)this;
      }
    }
    else {
      (this->super__policy)._vptr__policy = (_func_int **)app;
    }
    booster::intrusive_ptr_add_ref((application *)app);
  }
  return (intrusive_ptr<cppcms::application>)(application *)this;
}

Assistant:

virtual booster::intrusive_ptr<application> get(cppcms::service &srv)
	{
		if(self_->flags()==-1)
			return 0;
		if(!app_)
			app_ = get_new(srv);
		return app_;
	}